

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O0

bool xemmai::t_type_of<double>::t_cast<double>::f_is(t_object *a_object)

{
  t_type *this;
  t_object *a_object_local;
  
  if (a_object < (t_object *)0x3) {
    a_object_local._7_1_ = false;
  }
  else if (a_object[-1].v_data + 0x35 < (char *)0x2) {
    a_object_local._7_1_ = true;
  }
  else {
    this = t_object::f_type(a_object);
    a_object_local._7_1_ = t_type_of<xemmai::t_object>::f_derives<double>(this);
  }
  return a_object_local._7_1_;
}

Assistant:

static bool f_is(t_object* a_object)
		{
			if (!std::is_same_v<typename t_fundamental<T>::t_type, double>) return reinterpret_cast<uintptr_t>(a_object) >= c_tag__OBJECT && a_object->f_type()->f_derives<typename t_fundamental<T>::t_type>();
			switch (reinterpret_cast<uintptr_t>(a_object)) {
			case c_tag__NULL:
			case c_tag__FALSE:
			case c_tag__TRUE:
				return false;
			case c_tag__INTEGER:
			case c_tag__FLOAT:
				return true;
			default:
				return a_object->f_type()->f_derives<double>();
			}
		}